

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

void __thiscall icu_63::RuleBasedNumberFormat::dispose(RuleBasedNumberFormat *this)

{
  NFRuleSet *this_00;
  UnicodeString *pUVar1;
  NFRule *pNVar2;
  LocalizationInfo *pLVar3;
  uint32_t uVar4;
  void *in_RSI;
  long lVar5;
  NFRuleSet **ppNVar6;
  
  ppNVar6 = this->fRuleSets;
  if (ppNVar6 != (NFRuleSet **)0x0) {
    this_00 = *ppNVar6;
    while (this_00 != (NFRuleSet *)0x0) {
      ppNVar6 = ppNVar6 + 1;
      NFRuleSet::~NFRuleSet(this_00);
      UMemory::operator_delete((UMemory *)this_00,in_RSI);
      this_00 = *ppNVar6;
    }
    uprv_free_63(this->fRuleSets);
    this->fRuleSets = (NFRuleSet **)0x0;
  }
  pUVar1 = this->ruleSetDescriptions;
  if (pUVar1 != (UnicodeString *)0x0) {
    lVar5 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    if (lVar5 != 0) {
      lVar5 = lVar5 << 6;
      do {
        UnicodeString::~UnicodeString
                  ((UnicodeString *)
                   ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar5));
        lVar5 = lVar5 + -0x40;
      } while (lVar5 != 0);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
    this->ruleSetDescriptions = (UnicodeString *)0x0;
  }
  if (this->collator != (RuleBasedCollator *)0x0) {
    (*(this->collator->super_Collator).super_UObject._vptr_UObject[1])();
  }
  this->collator = (RuleBasedCollator *)0x0;
  if (this->decimalFormatSymbols != (DecimalFormatSymbols *)0x0) {
    (*(this->decimalFormatSymbols->super_UObject)._vptr_UObject[1])();
  }
  this->decimalFormatSymbols = (DecimalFormatSymbols *)0x0;
  pNVar2 = this->defaultInfinityRule;
  if (pNVar2 != (NFRule *)0x0) {
    NFRule::~NFRule(pNVar2);
    UMemory::operator_delete((UMemory *)pNVar2,in_RSI);
  }
  this->defaultInfinityRule = (NFRule *)0x0;
  pNVar2 = this->defaultNaNRule;
  if (pNVar2 != (NFRule *)0x0) {
    NFRule::~NFRule(pNVar2);
    UMemory::operator_delete((UMemory *)pNVar2,in_RSI);
  }
  this->defaultNaNRule = (NFRule *)0x0;
  if (this->lenientParseRules != (UnicodeString *)0x0) {
    (*(this->lenientParseRules->super_Replaceable).super_UObject._vptr_UObject[1])();
  }
  this->lenientParseRules = (UnicodeString *)0x0;
  if (this->capitalizationBrkIter != (BreakIterator *)0x0) {
    (*(this->capitalizationBrkIter->super_UObject)._vptr_UObject[1])();
  }
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  pLVar3 = this->localizations;
  if (pLVar3 != (LocalizationInfo *)0x0) {
    if ((pLVar3->refcount != 0) &&
       (uVar4 = pLVar3->refcount - 1, pLVar3->refcount = uVar4, uVar4 == 0)) {
      (*pLVar3->_vptr_LocalizationInfo[1])();
    }
    this->localizations = (LocalizationInfo *)0x0;
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::dispose()
{
    if (fRuleSets) {
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            delete *p;
        }
        uprv_free(fRuleSets);
        fRuleSets = NULL;
    }

    if (ruleSetDescriptions) {
        delete [] ruleSetDescriptions;
        ruleSetDescriptions = NULL;
    }

#if !UCONFIG_NO_COLLATION
    delete collator;
#endif
    collator = NULL;

    delete decimalFormatSymbols;
    decimalFormatSymbols = NULL;

    delete defaultInfinityRule;
    defaultInfinityRule = NULL;

    delete defaultNaNRule;
    defaultNaNRule = NULL;

    delete lenientParseRules;
    lenientParseRules = NULL;

#if !UCONFIG_NO_BREAK_ITERATION
    delete capitalizationBrkIter;
    capitalizationBrkIter = NULL;
#endif

    if (localizations) {
        localizations = localizations->unref();
    }
}